

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_gfx_read_screen_pixels(rf_color *dst,int width,int height)

{
  long lVar1;
  long lVar2;
  rf_color *prVar3;
  ulong uVar4;
  long lVar5;
  
  (*(rf__ctx->field_0).gfx_ctx.gl.ReadPixels)(0,0,width,height,0x1908,0x1401,dst);
  lVar1 = (long)(height + -1);
  lVar2 = (long)width;
  lVar5 = 0;
  if (0 < lVar2) {
    lVar5 = lVar2;
  }
  prVar3 = dst + lVar2 * lVar1;
  for (; uVar4 = 1, -1 < lVar1; lVar1 = lVar1 + -1) {
    for (; uVar4 - lVar5 != 1; uVar4 = uVar4 + 1) {
      dst[uVar4 - 1] = prVar3[uVar4 - 1];
      if ((uVar4 & 3) == 0) {
        dst[uVar4 - 1].a = 0xff;
      }
    }
    prVar3 = prVar3 + -lVar2;
    dst = dst + lVar2;
  }
  return;
}

Assistant:

RF_API void rf_gfx_read_screen_pixels(rf_color* dst, int width, int height)
{
    // NOTE 1: glReadPixels returns image flipped vertically -> (0,0) is the bottom left corner of the framebuffer
    // NOTE 2: We are getting alpha channel! Be careful, it can be transparent if not cleared properly!
    rf_gl.ReadPixels(0, 0, width, height, GL_RGBA, GL_UNSIGNED_BYTE, dst);

    for (rf_int y = height - 1; y >= 0; y--)
    {
        for (rf_int x = 0; x < width; x++)
        {
            dst[((height - 1) - y) * width + x] = dst[(y * width) + x]; // Flip line

            // Set alpha component value to 255 (no trasparent image retrieval)
            // NOTE: Alpha value has already been applied to RGB in framebuffer, we don't need it!
            if (((x + 1) % 4) == 0) dst[((height - 1) - y) * width + x].a = 255;
        }
    }
}